

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledGetElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout)

{
  ImplicitCallFlags IVar1;
  unsigned_short localRegisterID;
  ThreadContext *this_00;
  Var pvVar2;
  Var varIndex;
  
  this_00 = *(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8);
  IVar1 = this_00->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this_00);
  localRegisterID =
       (playout->super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).Value;
  pvVar2 = GetReg<unsigned_short>
                     (this,(playout->
                           super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                           Instance);
  varIndex = GetReg<unsigned_short>
                       (this,(playout->
                             super_OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                             Element);
  pvVar2 = ProfilingHelpers::ProfiledLdElem
                     (pvVar2,varIndex,*(FunctionBody **)(this + 0x88),playout->profileId,
                      SUB41((*(ushort *)(this + 0xd4) & 0x10) >> 4,0),
                      (bool)((byte)*(ushort *)(this + 0xd4) >> 7));
  SetReg<unsigned_short>(this,localRegisterID,pvVar2);
  this[0xd4] = (InterpreterStackFrame)((byte)this[0xd4] & 0x6f);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  this_00->implicitCallFlags = this_00->implicitCallFlags | IVar1;
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledGetElementI(const unaligned OpLayoutDynamicProfile<T>* playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        SetReg(
            playout->Value,
            ProfilingHelpers::ProfiledLdElem(
                GetReg(playout->Instance),
                GetReg(playout->Element),
                m_functionBody,
                playout->profileId,
                this->TestFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall),
                this->TestFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization)));

        this->ClearFlags(InterpreterStackFrameFlags_ProcessingBailOutOnArrayAccessHelperCall | InterpreterStackFrameFlags_ProcessingBailOutOnArraySpecialization);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
    }